

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

void ReadArray<aiColor4t<float>>(IOStream *stream,aiColor4t<float> *out,uint size)

{
  long lVar1;
  aiColor4D aVar2;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiColor4t<float>]");
  }
  if (out != (aiColor4t<float> *)0x0) {
    if (size != 0) {
      lVar1 = 0;
      do {
        aVar2 = Read<aiColor4t<float>>(stream);
        *(aiColor4D *)((long)&out->r + lVar1) = aVar2;
        lVar1 = lVar1 + 0x10;
      } while ((ulong)size << 4 != lVar1);
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiColor4t<float>]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}